

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

protobuf_test_messages_proto3_TestAllTypesProto3 *
upb_test_mutable_optional_msg_ext(upb_test_TestExtensions *msg,upb_Arena *arena)

{
  protobuf_test_messages_proto3_TestAllTypesProto3 *val;
  
  val = upb_test_optional_msg_ext(msg);
  if (val == (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0) {
    val = (protobuf_test_messages_proto3_TestAllTypesProto3 *)
          _upb_Message_New(&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init,arena);
    if (val == (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0) {
      val = (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0;
    }
    else {
      upb_test_set_optional_msg_ext(msg,val,arena);
    }
  }
  return val;
}

Assistant:

UPB_INLINE struct protobuf_test_messages_proto3_TestAllTypesProto3* upb_test_mutable_optional_msg_ext(struct upb_test_TestExtensions* msg,
                                    upb_Arena* arena) {
  struct protobuf_test_messages_proto3_TestAllTypesProto3* sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)upb_test_optional_msg_ext(msg);
  if (sub == NULL) {
    sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)_upb_Message_New(&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init, arena);
    if (sub) upb_test_set_optional_msg_ext(msg, sub, arena);
  }
  return sub;
}